

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

void deqp::gls::ub::anon_unknown_12::generateDeclaration(ostringstream *src,UniformBlock *block)

{
  ostream *poVar1;
  char *pcVar2;
  uint uVar3;
  pointer pUVar4;
  Indent local_3c;
  LayoutFlagsFmt local_38;
  LayoutFlagsFmt local_34;
  
  if ((block->m_flags & 0xf8) != 0) {
    poVar1 = std::operator<<((ostream *)src,"layout(");
    local_34.flags = block->m_flags & 0xf8;
    ub::operator<<(poVar1,&local_34);
    std::operator<<(poVar1,") ");
  }
  poVar1 = std::operator<<((ostream *)src,"uniform ");
  std::operator<<(poVar1,(block->m_blockName)._M_dataplus._M_p);
  std::operator<<((ostream *)src,"\n{\n");
  for (pUVar4 = (block->m_uniforms).
                super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pUVar4 != (block->m_uniforms).
                super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
                _M_impl.super__Vector_impl_data._M_finish; pUVar4 = pUVar4 + 1) {
    local_3c.level = 1;
    operator<<((ostream *)src,&local_3c);
    uVar3 = pUVar4->m_flags;
    if ((uVar3 & 0xf8) != 0) {
      poVar1 = std::operator<<((ostream *)src,"layout(");
      local_38.flags = pUVar4->m_flags & 0xf8;
      ub::operator<<(poVar1,&local_38);
      std::operator<<(poVar1,") ");
      uVar3 = pUVar4->m_flags;
    }
    generateDeclaration(src,&pUVar4->m_type,(pUVar4->m_name)._M_dataplus._M_p,1,uVar3 & 0xc00);
  }
  std::operator<<((ostream *)src,"}");
  if (((block->m_instanceName)._M_string_length != 0) &&
     ((block->m_instanceName)._M_dataplus._M_p != (pointer)0x0)) {
    poVar1 = std::operator<<((ostream *)src," ");
    pcVar2 = (char *)(block->m_instanceName)._M_string_length;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (block->m_instanceName)._M_dataplus._M_p;
    }
    std::operator<<(poVar1,pcVar2);
    if (0 < block->m_arraySize) {
      poVar1 = std::operator<<((ostream *)src,"[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,block->m_arraySize);
      std::operator<<(poVar1,"]");
    }
  }
  std::operator<<((ostream *)src,";\n");
  return;
}

Assistant:

void generateDeclaration (std::ostringstream& src, const UniformBlock& block)
{
	if ((block.getFlags() & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(block.getFlags() & LAYOUT_MASK) << ") ";

	src << "uniform " << block.getBlockName();
	src << "\n{\n";

	for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
	{
		src << Indent(1);
		generateDeclaration(src, *uniformIter, 1 /* indent level */);
	}

	src << "}";

	if (block.getInstanceName() != DE_NULL)
	{
		src << " " << block.getInstanceName();
		if (block.isArray())
			src << "[" << block.getArraySize() << "]";
	}
	else
		DE_ASSERT(!block.isArray());

	src << ";\n";
}